

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O3

void tcmalloc::SlowTLS::UnregisterEntry(Entry *entry)

{
  Entry *pEVar1;
  bool bVar2;
  SpinLockHolder local_18;
  SpinLockHolder h;
  
  local_18.lock_ = &lock_;
  LOCK();
  bVar2 = (__atomic_base<int>)lock_.lockword_.super___atomic_base<int>._M_i ==
          (__atomic_base<int>)0x0;
  if (bVar2) {
    lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar2) {
    SpinLock::SlowLock(&lock_);
  }
  pEVar1 = entry->next;
  *entry->prev = pEVar1;
  if (pEVar1 != (Entry *)0x0) {
    pEVar1->prev = entry->prev;
  }
  SpinLockHolder::~SpinLockHolder(&local_18);
  return;
}

Assistant:

static void UnregisterEntry(Entry* entry) {
    SpinLockHolder h(&lock_);
    ASSERT(*entry->prev == entry);
    Entry* next = *entry->prev = entry->next;
    if (next) {
      ASSERT(next->prev == &entry->next);
      next->prev = entry->prev;
    }
    entry->DebugDirty();
  }